

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo>::
AdapterPromiseNode<kj::(anonymous_namespace)::AsyncPipe&,kj::AsyncOutputStream&,unsigned_long&>
          (AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo>
           *this,AsyncPipe *params,AsyncOutputStream *params_1,unsigned_long *params_2)

{
  AsyncPipe *pipe;
  AsyncOutputStream *output;
  unsigned_long *puVar1;
  unsigned_long *params_local_2;
  AsyncOutputStream *params_local_1;
  AsyncPipe *params_local;
  AdapterPromiseNode<unsigned_long,_kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo> *this_local
  ;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<unsigned_long>::PromiseFulfiller
            ((PromiseFulfiller<unsigned_long> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_00cdde40;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_00cdde88;
  ExceptionOr<unsigned_long>::ExceptionOr((ExceptionOr<unsigned_long> *)(this + 0x18));
  this[0x188] = (AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo>
                 )0x1;
  pipe = fwd<kj::(anonymous_namespace)::AsyncPipe&>(params);
  output = fwd<kj::AsyncOutputStream&>(params_1);
  puVar1 = fwd<unsigned_long&>(params_2);
  anon_unknown_77::AsyncPipe::BlockedPumpTo::BlockedPumpTo
            ((BlockedPumpTo *)(this + 400),(PromiseFulfiller<unsigned_long> *)(this + 0x10),pipe,
             output,*puVar1);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}